

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O1

Constraint *
create_set_parameter_value_constraint(char *parameter_name,intptr_t value_to_set,size_t size_to_set)

{
  Constraint *pCVar1;
  
  pCVar1 = (Constraint *)malloc(0x80);
  pCVar1->destroy = destroy_empty_constraint;
  pCVar1->failure_message = failure_message_for;
  pCVar1->expected_value_name = (char *)0x0;
  pCVar1->parameter_name = (char *)0x0;
  pCVar1->actual_value_message = "\n\t\tactual value:\t\t\t[%ld]";
  pCVar1->expected_value_message = "\t\texpected value:\t\t\t[%ld]";
  pCVar1->type = CGREEN_CONTENT_SETTER_CONSTRAINT;
  pCVar1->compare = compare_true;
  pCVar1->execute = set_contents;
  pCVar1->name = "set parameter value";
  make_cgreen_integer_value(&pCVar1->expected_value,value_to_set);
  pCVar1->size_of_expected_value = size_to_set;
  pCVar1->parameter_name = parameter_name;
  return pCVar1;
}

Assistant:

Constraint *create_set_parameter_value_constraint(const char *parameter_name, intptr_t value_to_set, size_t size_to_set) {
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_CONTENT_SETTER_CONSTRAINT;

    constraint->compare = &compare_true;
    constraint->execute = &set_contents;
    constraint->name = "set parameter value";
    constraint->expected_value = make_cgreen_integer_value(value_to_set);
    constraint->size_of_expected_value = size_to_set;
    constraint->parameter_name = parameter_name;

    return constraint;
}